

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lace.c
# Opt level: O1

void lace_yield(WorkerP *__lace_worker,Task *__lace_dq_head)

{
  Task _t;
  Task local_48;
  
  local_48.f = (lace_newframe.t)->f;
  local_48.thief = (lace_newframe.t)->thief;
  local_48.d._0_8_ = *(undefined8 *)(lace_newframe.t)->d;
  local_48.d._8_8_ = *(undefined8 *)((lace_newframe.t)->d + 8);
  local_48.d._16_8_ = *(undefined8 *)((lace_newframe.t)->d + 0x10);
  local_48.d._24_8_ = *(undefined8 *)((lace_newframe.t)->d + 0x18);
  local_48.d._32_8_ = *(undefined8 *)((lace_newframe.t)->d + 0x20);
  local_48.d._40_8_ = *(undefined8 *)((lace_newframe.t)->d + 0x28);
  LOCK();
  UNLOCK();
  if (n_workers == lace_bar.count + 1U) {
    lace_bar.wait = 1 - lace_bar.wait;
    lace_bar.count = 0;
    LOCK();
    lace_bar.leaving = n_workers - 1;
    UNLOCK();
    lace_exec_in_new_frame(__lace_worker,__lace_dq_head,&local_48);
    return;
  }
  do {
  } while( true );
}

Assistant:

void
lace_yield(WorkerP *__lace_worker, Task *__lace_dq_head)
{
    // make a local copy of the task
    Task _t;
    memcpy(&_t, lace_newframe.t, sizeof(Task));

    // wait until all workers have made a local copy
    lace_barrier();

    lace_exec_in_new_frame(__lace_worker, __lace_dq_head, &_t);
}